

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdump.c
# Opt level: O3

int main(int argc,char **argv)

{
  utf8_char_t *data;
  vtt_t *vtt;
  vtt_block_t *cue;
  size_t size;
  caption_frame_t frame;
  size_t local_1e70;
  caption_frame_t local_1e68;
  
  if (1 < argc) {
    data = utf8_load_text_file(argv[1],&local_1e70);
    vtt = vtt_parse(data,local_1e70);
    cue = vtt->cue_head;
    if (cue != (vtt_block_t *)0x0) {
      do {
        caption_frame_init(&local_1e68);
        vtt_cue_to_caption_frame(cue,&local_1e68);
        caption_frame_dump(&local_1e68);
        cue = cue->next;
      } while (cue != (_vtt_block_t *)0x0);
    }
    vtt_free(vtt);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    caption_frame_t frame;

    if (argc < 2) {
        return 0;
    }

    size_t size;
    utf8_char_t* data = utf8_load_text_file(argv[1], &size);

    vtt_t* vtt = vtt_parse(data, size);

    for (vtt_block_t* cue = vtt->cue_head; cue != NULL; cue = cue->next) {
        caption_frame_init(&frame);
        vtt_cue_to_caption_frame(cue, &frame);
        caption_frame_dump(&frame);
    }

    vtt_free(vtt);
}